

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O2

void __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::Consume::cancel_consume_impl(Consume *this)

{
  raw_atomic_store(&this->m_control->m_next,this->m_next_ptr - 2,memory_order_seq_cst);
  this->m_next_ptr = 0;
  return;
}

Assistant:

void cancel_consume_impl() noexcept
                {
#if DENSITY_DEBUG_INTERNAL
                    consume_dbg_checks();
#endif

                    // remove LfQueue_Busy and add LfQueue_Dead
                    raw_atomic_store(&m_control->m_next, m_next_ptr - LfQueue_Dead, mem_release);
                    m_next_ptr = 0;
                }